

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Highs.cpp
# Opt level: O1

HighsStatus __thiscall Highs::readOptions(Highs *this,string *filename)

{
  function<void_(int,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_HighsCallbackDataOut_*,_HighsCallbackDataIn_*,_void_*)>
  *this_00;
  pointer pcVar1;
  HighsLoadOptionsStatus HVar2;
  HighsStatus HVar3;
  HighsLogOptions report_log_options;
  string local_a8;
  HighsLogOptions local_88;
  
  if (filename->_M_string_length == 0) {
    highsLogUser(&(this->options_).super_HighsOptionsStruct.log_options,kWarning,
                 "Empty file name so not reading options\n");
    HVar3 = kWarning;
  }
  else {
    local_88.log_stream = (this->options_).super_HighsOptionsStruct.log_options.log_stream;
    local_88.output_flag = (this->options_).super_HighsOptionsStruct.log_options.output_flag;
    local_88.log_to_console = (this->options_).super_HighsOptionsStruct.log_options.log_to_console;
    local_88.log_dev_level = (this->options_).super_HighsOptionsStruct.log_options.log_dev_level;
    local_88.user_log_callback =
         (this->options_).super_HighsOptionsStruct.log_options.user_log_callback;
    local_88.user_log_callback_data =
         (this->options_).super_HighsOptionsStruct.log_options.user_log_callback_data;
    this_00 = &local_88.user_callback;
    std::
    function<void_(int,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_HighsCallbackDataOut_*,_HighsCallbackDataIn_*,_void_*)>
    ::function(this_00,&(this->options_).super_HighsOptionsStruct.log_options.user_callback);
    local_88.user_callback_active =
         (this->options_).super_HighsOptionsStruct.log_options.user_callback_active;
    local_88.user_callback_data =
         (this->options_).super_HighsOptionsStruct.log_options.user_callback_data;
    pcVar1 = (filename->_M_dataplus)._M_p;
    local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_a8,pcVar1,pcVar1 + filename->_M_string_length);
    HVar2 = loadOptionsFromFile(&local_88,&this->options_,&local_a8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
      operator_delete(local_a8._M_dataplus._M_p);
    }
    HVar3 = kError;
    if ((HVar2 != kError) && (HVar2 != kEmpty)) {
      HVar3 = optionChangeAction(this);
    }
    if (local_88.user_callback.super__Function_base._M_manager != (_Manager_type)0x0) {
      (*local_88.user_callback.super__Function_base._M_manager)
                ((_Any_data *)this_00,(_Any_data *)this_00,__destroy_functor);
    }
  }
  return HVar3;
}

Assistant:

HighsStatus Highs::readOptions(const std::string& filename) {
  if (filename.size() <= 0) {
    highsLogUser(options_.log_options, HighsLogType::kWarning,
                 "Empty file name so not reading options\n");
    return HighsStatus::kWarning;
  }
  HighsLogOptions report_log_options = options_.log_options;
  switch (loadOptionsFromFile(report_log_options, options_, filename)) {
    case HighsLoadOptionsStatus::kError:
    case HighsLoadOptionsStatus::kEmpty:
      return HighsStatus::kError;
    default:
      break;
  }
  return optionChangeAction();
}